

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O0

void generateSomeValues(size_t size,vector<int,_std::allocator<int>_> *arr)

{
  result_type rVar1;
  reference pvVar2;
  ulong local_13a8;
  size_t i;
  mt19937 generator;
  vector<int,_std::allocator<int>_> *arr_local;
  size_t size_local;
  
  generator._M_p = (size_t)arr;
  rVar1 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&i,rVar1);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)generator._M_p,size);
  for (local_13a8 = 0; local_13a8 < size; local_13a8 = local_13a8 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&i);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)generator._M_p,local_13a8);
    *pvVar2 = (value_type)rVar1;
  }
  return;
}

Assistant:

void generateSomeValues(size_t size, std::vector<int>& arr) {
    std::mt19937 generator(time(0));

    arr.resize(size);

    for (size_t i = 0; i < size; i++)
        arr[i] = generator();
}